

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

string * __thiscall
smf::MidiFile::base64Encode(string *__return_storage_ptr__,MidiFile *this,string *input)

{
  uint uVar1;
  char cVar2;
  pointer pcVar3;
  pointer pcVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar3 = (input->_M_dataplus)._M_p;
  pcVar4 = pcVar3 + input->_M_string_length;
  uVar1 = 0xfffffffa;
  while( true ) {
    cVar2 = (char)__return_storage_ptr__;
    if (pcVar3 == pcVar4) break;
    for (uVar1 = uVar1 + 8; -1 < (int)uVar1; uVar1 = uVar1 - 6) {
      std::__cxx11::string::push_back(cVar2);
    }
    pcVar3 = pcVar3 + 1;
  }
  if (0xfffffffa < uVar1) {
    std::__cxx11::string::push_back(cVar2);
  }
  while ((__return_storage_ptr__->_M_string_length & 3) != 0) {
    std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::base64Encode(const std::string& input) {
	std::string output;
	output.reserve(((input.size()/3) + (input.size() % 3 > 0)) * 4);
	int vala = 0;
	int valb = -6;
	for (uchar c : input) {
		vala = (vala << 8) + c;
		valb += 8;
		while (valb >=0) {
			output.push_back(MidiFile::encodeLookup[(vala >> valb) & 0x3F]);
			valb -= 6;
		}
	}
	if (valb > -6) {
		output.push_back(MidiFile::encodeLookup[((vala << 8) >> (valb + 8)) & 0x3F]);
	}
	while (output.size() % 4) {
		output.push_back(MidiFile::encodeLookup.back());
	}
	return output;
}